

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_sndio.c
# Opt level: O0

void * sndio_mainloop(void *arg)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  pollfd *__fds;
  long lVar4;
  size_t sVar5;
  long in_RDI;
  long nfr;
  size_t rend;
  size_t rstart;
  size_t pend;
  size_t pstart;
  int state;
  int revents;
  int events;
  int nfds;
  int prime;
  int eof;
  int n;
  cubeb_stream_conflict2 *s;
  pollfd *pfds;
  ulong local_60;
  ulong local_58;
  ulong uVar6;
  ulong nsamp;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 uVar7;
  uint local_34;
  int local_2c;
  
  bVar1 = false;
  uVar7 = 0;
  nsamp = 0;
  uVar6 = 0;
  local_58 = 0;
  iVar2 = (*cubeb_sio_nfds)(*(sio_hdl **)(in_RDI + 0x40));
  __fds = (pollfd *)calloc((long)iVar2,8);
  if (__fds != (pollfd *)0x0) {
    (**(code **)(in_RDI + 0x98))(in_RDI,*(undefined8 *)(in_RDI + 8),0);
    pthread_mutex_lock((pthread_mutex_t *)(in_RDI + 0x18));
    iVar2 = (*cubeb_sio_start)(*(sio_hdl **)(in_RDI + 0x40));
    if (iVar2 == 0) {
      pthread_mutex_unlock((pthread_mutex_t *)(in_RDI + 0x18));
      free(__fds);
    }
    else {
      if ((*(uint *)(in_RDI + 0x48) & 1) == 0) {
        local_2c = 0;
        local_58 = 0;
        local_60 = (ulong)(uint)(*(int *)(in_RDI + 0x68) * *(int *)(in_RDI + 0x6c));
      }
      else {
        uVar6 = (ulong)(uint)(*(int *)(in_RDI + 0x68) * *(int *)(in_RDI + 0x70));
        local_2c = *(int *)(in_RDI + 0x7c);
        nsamp = uVar6;
        local_60 = local_58;
        if ((*(uint *)(in_RDI + 0x48) & 2) != 0) {
          memset(*(void **)(in_RDI + 0x58),0,
                 (ulong)(uint)(*(int *)(in_RDI + 0x68) * *(int *)(in_RDI + 0x6c)));
          local_58 = (ulong)(uint)(*(int *)(in_RDI + 0x68) * *(int *)(in_RDI + 0x6c));
          local_60 = local_58;
        }
      }
LAB_00117ba0:
      if (*(int *)(in_RDI + 0x4c) != 0) {
        if ((((*(uint *)(in_RDI + 0x48) & 1) == 0) || (nsamp == uVar6)) &&
           (((*(uint *)(in_RDI + 0x48) & 2) == 0 || (local_58 == local_60)))) {
          if (bVar1) {
            uVar7 = 2;
            goto LAB_00117ff1;
          }
          if (((*(uint *)(in_RDI + 0x48) & 2) != 0) && (*(int *)(in_RDI + 0x50) != 0)) {
            s16_to_float(*(void **)(in_RDI + 0x58),
                         (ulong)(uint)(*(int *)(in_RDI + 0x68) * *(int *)(in_RDI + 0x74)));
          }
          pthread_mutex_unlock((pthread_mutex_t *)(in_RDI + 0x18));
          lVar4 = (**(code **)(in_RDI + 0x90))
                            (in_RDI,*(undefined8 *)(in_RDI + 8),*(undefined8 *)(in_RDI + 0x58),
                             *(undefined8 *)(in_RDI + 0x60),*(undefined4 *)(in_RDI + 0x68));
          pthread_mutex_lock((pthread_mutex_t *)(in_RDI + 0x18));
          if (lVar4 < 0) {
            uVar7 = 3;
            goto LAB_00117ff1;
          }
          *(long *)(in_RDI + 0x88) = lVar4 + *(long *)(in_RDI + 0x88);
          if (lVar4 < (long)(ulong)*(uint *)(in_RDI + 0x68)) {
            if (((*(uint *)(in_RDI + 0x48) & 1) == 0) || (lVar4 == 0)) {
              uVar7 = 2;
              goto LAB_00117ff1;
            }
            uVar6 = lVar4 * (ulong)*(uint *)(in_RDI + 0x70);
            bVar1 = true;
          }
          if (0 < local_2c) {
            local_2c = local_2c + -1;
          }
          if ((*(uint *)(in_RDI + 0x48) & 1) != 0) {
            if (*(int *)(in_RDI + 0x50) == 0) {
              s16_setvol(*(void **)(in_RDI + 0x60),lVar4 * (ulong)*(uint *)(in_RDI + 0x78),
                         *(float *)(in_RDI + 0xa0));
            }
            else {
              float_to_s16((void *)CONCAT44(uVar7,in_stack_ffffffffffffffc0),nsamp,
                           (float)(uVar6 >> 0x20));
            }
          }
          if ((*(uint *)(in_RDI + 0x48) & 2) != 0) {
            local_58 = 0;
          }
          if ((*(uint *)(in_RDI + 0x48) & 1) != 0) {
            nsamp = 0;
          }
        }
        local_34 = 0;
        if ((((*(uint *)(in_RDI + 0x48) & 2) != 0) && (local_58 < local_60)) && (local_2c == 0)) {
          local_34 = 1;
        }
        if (((*(uint *)(in_RDI + 0x48) & 1) != 0) && (nsamp < uVar6)) {
          local_34 = local_34 | 4;
        }
        iVar2 = (*cubeb_sio_pollfd)(*(sio_hdl **)(in_RDI + 0x40),(pollfd *)__fds,local_34);
        if (0 < iVar2) goto code_r0x00117e68;
        goto LAB_00117eaa;
      }
      uVar7 = 1;
LAB_00117ff1:
      (*cubeb_sio_stop)(*(sio_hdl **)(in_RDI + 0x40));
      *(undefined8 *)(in_RDI + 0x80) = *(undefined8 *)(in_RDI + 0x88);
      pthread_mutex_unlock((pthread_mutex_t *)(in_RDI + 0x18));
      (**(code **)(in_RDI + 0x98))(in_RDI,*(undefined8 *)(in_RDI + 8),uVar7);
      free(__fds);
    }
  }
  return (void *)0x0;
code_r0x00117e68:
  pthread_mutex_unlock((pthread_mutex_t *)(in_RDI + 0x18));
  iVar2 = poll(__fds,(long)iVar2,-1);
  pthread_mutex_lock((pthread_mutex_t *)(in_RDI + 0x18));
  if (-1 < iVar2) {
LAB_00117eaa:
    uVar3 = (*cubeb_sio_revents)(*(sio_hdl **)(in_RDI + 0x40),(pollfd *)__fds);
    if ((uVar3 & 0x10) != 0) {
      uVar7 = 3;
      goto LAB_00117ff1;
    }
    if ((uVar3 & 4) != 0) {
      sVar5 = (*cubeb_sio_write)(*(sio_hdl **)(in_RDI + 0x40),
                                 (void *)(*(long *)(in_RDI + 0x60) + nsamp),uVar6 - nsamp);
      if (((int)sVar5 == 0) && (iVar2 = (*cubeb_sio_eof)(*(sio_hdl **)(in_RDI + 0x40)), iVar2 != 0))
      {
        uVar7 = 3;
        goto LAB_00117ff1;
      }
      nsamp = (long)(int)sVar5 + nsamp;
    }
    if ((uVar3 & 1) != 0) {
      sVar5 = (*cubeb_sio_read)(*(sio_hdl **)(in_RDI + 0x40),
                                (void *)(*(long *)(in_RDI + 0x58) + local_58),local_60 - local_58);
      if (((int)sVar5 == 0) && (iVar2 = (*cubeb_sio_eof)(*(sio_hdl **)(in_RDI + 0x40)), iVar2 != 0))
      {
        uVar7 = 3;
        goto LAB_00117ff1;
      }
      local_58 = (long)(int)sVar5 + local_58;
    }
    if ((0 < local_2c) && ((*(uint *)(in_RDI + 0x48) & 2) != 0)) {
      local_58 = local_60;
    }
  }
  goto LAB_00117ba0;
}

Assistant:

static void *
sndio_mainloop(void * arg)
{
  struct pollfd * pfds;
  cubeb_stream * s = arg;
  int n, eof = 0, prime, nfds, events, revents, state = CUBEB_STATE_STARTED;
  size_t pstart = 0, pend = 0, rstart = 0, rend = 0;
  long nfr;

  nfds = WRAP(sio_nfds)(s->hdl);
  pfds = calloc(nfds, sizeof(struct pollfd));
  if (pfds == NULL)
    return NULL;

  DPR("sndio_mainloop()\n");
  s->state_cb(s, s->arg, CUBEB_STATE_STARTED);
  pthread_mutex_lock(&s->mtx);
  if (!WRAP(sio_start)(s->hdl)) {
    pthread_mutex_unlock(&s->mtx);
    free(pfds);
    return NULL;
  }
  DPR("sndio_mainloop(), started\n");

  if (s->mode & SIO_PLAY) {
    pstart = pend = s->nfr * s->pbpf;
    prime = s->nblks;
    if (s->mode & SIO_REC) {
      memset(s->rbuf, 0, s->nfr * s->rbpf);
      rstart = rend = s->nfr * s->rbpf;
    }
  } else {
    prime = 0;
    rstart = 0;
    rend = s->nfr * s->rbpf;
  }

  for (;;) {
    if (!s->active) {
      DPR("sndio_mainloop() stopped\n");
      state = CUBEB_STATE_STOPPED;
      break;
    }

    /* do we have a complete block? */
    if ((!(s->mode & SIO_PLAY) || pstart == pend) &&
        (!(s->mode & SIO_REC) || rstart == rend)) {

      if (eof) {
        DPR("sndio_mainloop() drained\n");
        state = CUBEB_STATE_DRAINED;
        break;
      }

      if ((s->mode & SIO_REC) && s->conv)
        s16_to_float(s->rbuf, s->nfr * s->rchan);

      /* invoke call-back, it returns less that s->nfr if done */
      pthread_mutex_unlock(&s->mtx);
      nfr = s->data_cb(s, s->arg, s->rbuf, s->pbuf, s->nfr);
      pthread_mutex_lock(&s->mtx);
      if (nfr < 0) {
        DPR("sndio_mainloop() cb err\n");
        state = CUBEB_STATE_ERROR;
        break;
      }
      s->swpos += nfr;

      /* was this last call-back invocation (aka end-of-stream) ? */
      if (nfr < s->nfr) {

        if (!(s->mode & SIO_PLAY) || nfr == 0) {
          state = CUBEB_STATE_DRAINED;
          break;
        }

        /* need to write (aka drain) the partial play block we got */
        pend = nfr * s->pbpf;
        eof = 1;
      }

      if (prime > 0)
        prime--;

      if (s->mode & SIO_PLAY) {
        if (s->conv)
          float_to_s16(s->pbuf, nfr * s->pchan, s->volume);
        else
          s16_setvol(s->pbuf, nfr * s->pchan, s->volume);
      }

      if (s->mode & SIO_REC)
        rstart = 0;
      if (s->mode & SIO_PLAY)
        pstart = 0;
    }

    events = 0;
    if ((s->mode & SIO_REC) && rstart < rend && prime == 0)
      events |= POLLIN;
    if ((s->mode & SIO_PLAY) && pstart < pend)
      events |= POLLOUT;
    nfds = WRAP(sio_pollfd)(s->hdl, pfds, events);

    if (nfds > 0) {
      pthread_mutex_unlock(&s->mtx);
      n = poll(pfds, nfds, -1);
      pthread_mutex_lock(&s->mtx);
      if (n < 0)
        continue;
    }

    revents = WRAP(sio_revents)(s->hdl, pfds);

    if (revents & POLLHUP) {
      state = CUBEB_STATE_ERROR;
      break;
    }

    if (revents & POLLOUT) {
      n = WRAP(sio_write)(s->hdl, s->pbuf + pstart, pend - pstart);
      if (n == 0 && WRAP(sio_eof)(s->hdl)) {
        DPR("sndio_mainloop() werr\n");
        state = CUBEB_STATE_ERROR;
        break;
      }
      pstart += n;
    }

    if (revents & POLLIN) {
      n = WRAP(sio_read)(s->hdl, s->rbuf + rstart, rend - rstart);
      if (n == 0 && WRAP(sio_eof)(s->hdl)) {
        DPR("sndio_mainloop() rerr\n");
        state = CUBEB_STATE_ERROR;
        break;
      }
      rstart += n;
    }

    /* skip rec block, if not recording (yet) */
    if (prime > 0 && (s->mode & SIO_REC))
      rstart = rend;
  }
  WRAP(sio_stop)(s->hdl);
  s->hwpos = s->swpos;
  pthread_mutex_unlock(&s->mtx);
  s->state_cb(s, s->arg, state);
  free(pfds);
  return NULL;
}